

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonwriter.cpp
# Opt level: O0

bool __thiscall CJsonWriter::CanWriteDatatype(CJsonWriter *this)

{
  CState *pCVar1;
  long in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  bool bVar2;
  
  bVar2 = true;
  if (*(int *)(in_RDI + 0x28) != 0) {
    pCVar1 = TopState((CJsonWriter *)CONCAT17(1,in_stack_fffffffffffffff0));
    bVar2 = true;
    if (pCVar1->m_Kind != '\x02') {
      pCVar1 = TopState((CJsonWriter *)CONCAT17(1,in_stack_fffffffffffffff0));
      bVar2 = pCVar1->m_Kind == '\x03';
    }
  }
  return bVar2;
}

Assistant:

bool CJsonWriter::CanWriteDatatype()
{
	return m_NumStates == 0
		|| TopState()->m_Kind == STATE_ARRAY
		|| TopState()->m_Kind == STATE_ATTRIBUTE;
}